

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O1

EndpointInfo * __thiscall
helics::InterfaceInfo::getEndpoint(InterfaceInfo *this,InterfaceHandle handle)

{
  EndpointInfo *pEVar1;
  shared_mutex *__rwlock;
  InterfaceHandle local_1c;
  
  __rwlock = &(this->endpoints).m_mutex;
  local_1c.hid = handle.hid;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  pEVar1 = gmlc::containers::
           DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           ::find(&(this->endpoints).m_obj,&local_1c);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return pEVar1;
}

Assistant:

const EndpointInfo* InterfaceInfo::getEndpoint(InterfaceHandle handle) const
{
    return endpoints.lock_shared()->find(handle);
}